

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::export_class_to_library
          (t_dart_generator *this,string *file_name,string *class_name)

{
  string subdir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  if ((this->library_prefix_)._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&local_118);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_118);
  }
  std::operator+(&local_f8,"export \'",&local_118);
  std::operator+(&local_d8,&local_f8,"/");
  std::operator+(&local_b8,&local_d8,file_name);
  std::operator+(&local_98,&local_b8,".dart\' show ");
  std::operator+(&local_78,&local_98,class_name);
  std::operator+(&local_58,&local_78,";");
  std::operator+(&local_38,&local_58,&::endl_abi_cxx11_);
  std::__cxx11::string::append((string *)&this->library_exports_);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  return;
}

Assistant:

void t_dart_generator::export_class_to_library(string file_name, string class_name) {
  string subdir;
  if (library_prefix_.empty()) {
    subdir = "src";
  } else {
    subdir = library_name_;
  }
  library_exports_ += "export '" + subdir + "/" + file_name + ".dart' show " + class_name + ";" + endl;
}